

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O1

void __thiscall Hes_Emu::cpu_write_(Hes_Emu *this,hes_addr_t addr,int data)

{
  state_t *psVar1;
  blip_time_t time;
  uint uVar2;
  int iVar3;
  
  psVar1 = (this->super_Hes_Cpu).state;
  iVar3 = psVar1->base + psVar1->time;
  if (addr - 0x800 < 10) {
    time = (this->super_Hes_Cpu).end_time_ + 8;
    if (iVar3 < time) {
      time = iVar3;
    }
    Hes_Apu::write_data(&this->apu,time,addr,data);
    return;
  }
  if ((int)addr < 0xc00) {
    if ((addr < 4) && (addr != 1)) {
      cpu_write_vdp(this,addr,data);
      return;
    }
  }
  else if ((int)addr < 0x1402) {
    if (addr == 0xc00) {
      run_until(this,iVar3);
      iVar3 = (data & 0x7fU) + 1;
      (this->timer).raw_load = iVar3;
      iVar3 = iVar3 * this->timer_base + 1;
      (this->timer).load = iVar3;
      (this->timer).count = iVar3;
    }
    else if (addr == 0xc01) {
      uVar2 = data & 1;
      if (uVar2 == (this->timer).enabled) {
        return;
      }
      run_until(this,iVar3);
      (this->timer).enabled = (byte)uVar2;
      if (uVar2 != 0) {
        (this->timer).count = (this->timer).load;
      }
    }
  }
  else if (addr == 0x1402) {
    run_until(this,iVar3);
    (this->irq).disables = (byte)data;
  }
  else if (addr == 0x1403) {
    run_until(this,iVar3);
    if ((this->timer).enabled != '\0') {
      (this->timer).count = (this->timer).load;
    }
    (this->timer).fired = '\0';
  }
  irq_changed(this);
  return;
}

Assistant:

void Hes_Emu::cpu_write_( hes_addr_t addr, int data )
{
	if ( unsigned (addr - apu.start_addr) <= apu.end_addr - apu.start_addr )
	{
		GME_APU_HOOK( this, addr - apu.start_addr, data );
		// avoid going way past end when a long block xfer is writing to I/O space
		hes_time_t t = min( time(), end_time() + 8 );
		apu.write_data( t, addr, data );
		return;
	}
	
	hes_time_t time = this->time();
	switch ( addr )
	{
	case 0x0000:
	case 0x0002:
	case 0x0003:
		cpu_write_vdp( addr, data );
		return;
	
	case 0x0C00: {
		run_until( time );
		timer.raw_load = (data & 0x7F) + 1;
		recalc_timer_load();
		timer.count = timer.load;
		break;
	}
	
	case 0x0C01:
		data &= 1;
		if ( timer.enabled == data )
			return;
		run_until( time );
		timer.enabled = data;
		if ( data )
			timer.count = timer.load;
		break;
	
	case 0x1402:
		run_until( time );
		irq.disables = data;
		if ( (data & 0xF8) && (data & 0xF8) != 0xF8 ) // flag questionable values
			debug_printf( "Int mask: $%02X\n", data );
		break;
	
	case 0x1403:
		run_until( time );
		if ( timer.enabled )
			timer.count = timer.load;
		timer.fired = false;
		break;
	
#ifndef NDEBUG
	case 0x1000: // I/O port
	case 0x0402: // palette
	case 0x0403:
	case 0x0404:
	case 0x0405:
		return;
		
	default:
		debug_printf( "unmapped write $%04X <- $%02X\n", addr, data );
		return;
#endif
	}
	
	irq_changed();
}